

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

int imagetotga(opj_image_t *image,char *outfile)

{
  OPJ_UINT32 *pOVar1;
  byte bVar2;
  opj_image_comp_t *poVar3;
  int iVar4;
  FILE *__s;
  size_t sVar5;
  OPJ_UINT32 OVar6;
  long lVar7;
  OPJ_UINT32 OVar8;
  uint uVar9;
  ulong uVar10;
  OPJ_UINT32 OVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  uchar value;
  uchar uc0;
  OPJ_UINT16 us0;
  OPJ_UINT16 image_h;
  uchar image_type;
  OPJ_UINT16 image_w;
  undefined1 local_7a;
  undefined1 local_79;
  undefined2 local_78;
  char local_75;
  float local_74;
  int local_70;
  int local_6c;
  undefined2 local_68;
  undefined1 local_66;
  undefined1 local_65;
  OPJ_UINT32 local_64;
  OPJ_UINT32 local_60;
  OPJ_UINT32 local_5c;
  ulong local_58;
  int local_50;
  float local_4c;
  float local_48;
  undefined2 local_42;
  char *local_40;
  long local_38;
  
  __s = fopen(outfile,"wb");
  if (__s == (FILE *)0x0) {
    fprintf(_stderr,"ERROR -> failed to open %s for writing\n",outfile);
  }
  else {
    uVar9 = image->numcomps;
    local_58 = (ulong)uVar9;
    lVar7 = 0;
    do {
      if ((ulong)(uVar9 - 1) * 0x40 + 0x40 == lVar7 + 0x40) {
        OVar11 = image->comps->w;
        OVar8 = image->comps->h;
        if (OVar8 != 0 && OVar11 != 0) {
          local_75 = ((uVar9 - 2 & 0xfffffffd) == 0) * '\b' + '\x18';
          local_79 = 0;
          sVar5 = fwrite(&local_79,1,1,__s);
          if ((sVar5 == 1) && (sVar5 = fwrite(&local_79,1,1,__s), sVar5 == 1)) {
            local_65 = 2;
            sVar5 = fwrite(&local_65,1,1,__s);
            if (sVar5 == 1) {
              local_78 = 0;
              sVar5 = fwrite(&local_78,2,1,__s);
              if ((((sVar5 == 1) && (sVar5 = fwrite(&local_78,2,1,__s), sVar5 == 1)) &&
                  (sVar5 = fwrite(&local_79,1,1,__s), sVar5 == 1)) &&
                 ((sVar5 = fwrite(&local_78,2,1,__s), sVar5 == 1 &&
                  (sVar5 = fwrite(&local_78,2,1,__s), sVar5 == 1)))) {
                local_42 = (undefined2)OVar11;
                local_68 = (undefined2)OVar8;
                sVar5 = fwrite(&local_42,2,1,__s);
                if ((sVar5 == 1) &&
                   ((sVar5 = fwrite(&local_68,2,1,__s), sVar5 == 1 &&
                    (sVar5 = fwrite(&local_75,1,1,__s), sVar5 == 1)))) {
                  local_66 = 0x28;
                  sVar5 = fwrite(&local_66,1,1,__s);
                  if (sVar5 == 1) {
                    poVar3 = image->comps;
                    bVar2 = (byte)poVar3->prec;
                    local_50 = 1 << (bVar2 - 1 & 0x1f);
                    if (poVar3->sgnd == 0) {
                      local_50 = 0;
                    }
                    iVar12 = 0;
                    local_70 = 0;
                    local_6c = 0;
                    if (2 < image->numcomps) {
                      local_6c = 0;
                      local_70 = 0;
                      if (poVar3[1].sgnd != 0) {
                        local_70 = 1 << ((char)poVar3[1].prec - 1U & 0x1f);
                      }
                      if (poVar3[2].sgnd != 0) {
                        local_6c = 1 << ((char)poVar3[2].prec - 1U & 0x1f);
                      }
                    }
                    local_40 = outfile;
                    if ((int)OVar8 < 1) goto LAB_00109528;
                    local_74 = 255.0 / (float)~(-1 << (bVar2 & 0x1f));
                    local_38 = (ulong)(image->numcomps - 1) << 6;
                    OVar6 = 0;
                    local_64 = OVar8;
                    local_60 = OVar11;
                    goto LAB_0010931a;
                  }
                }
              }
            }
          }
          imagetotga_cold_2();
        }
        iVar12 = 1;
        goto LAB_00109528;
      }
      poVar3 = image->comps;
    } while ((((poVar3->dx == *(OPJ_UINT32 *)((long)&poVar3[1].dx + lVar7)) &&
              (poVar3->dy == *(OPJ_UINT32 *)((long)&poVar3[1].dy + lVar7))) &&
             (poVar3->prec == *(OPJ_UINT32 *)((long)&poVar3[1].prec + lVar7))) &&
            (pOVar1 = (OPJ_UINT32 *)((long)&poVar3[1].sgnd + lVar7), lVar7 = lVar7 + 0x40,
            poVar3->sgnd == *pOVar1));
    imagetotga_cold_1();
  }
  return 1;
LAB_0010931a:
  iVar4 = 0;
  if (0 < (int)OVar11) {
    uVar9 = OVar6 * OVar11;
    local_5c = OVar6;
    do {
      poVar3 = image->comps;
      uVar10 = (ulong)uVar9;
      iVar12 = poVar3->data[uVar10] + local_50;
      local_4c = (float)iVar12;
      fVar13 = local_4c;
      local_48 = local_4c;
      if (2 < image->numcomps) {
        local_48 = (float)(poVar3[1].data[uVar10] + local_70);
        fVar13 = (float)(poVar3[2].data[uVar10] + local_6c);
      }
      fVar14 = 255.0;
      if ((fVar13 <= 255.0) && (fVar14 = fVar13, fVar13 < 0.0)) {
        fVar14 = 0.0;
      }
      local_7a = (undefined1)(int)(fVar14 * local_74);
      sVar5 = fwrite(&local_7a,1,1,__s);
      if (sVar5 == 0) {
LAB_001094f9:
        fprintf(_stderr,"failed to write 1 byte for %s\n",local_40);
        iVar4 = 5;
        OVar11 = local_60;
        OVar8 = local_64;
        OVar6 = local_5c;
        goto LAB_001094e9;
      }
      fVar13 = 255.0;
      if ((local_48 <= 255.0) && (fVar13 = local_48, local_48 < 0.0)) {
        fVar13 = 0.0;
      }
      local_7a = (undefined1)(int)(fVar13 * local_74);
      sVar5 = fwrite(&local_7a,1,1,__s);
      if (sVar5 == 0) goto LAB_001094f9;
      fVar13 = 255.0;
      if ((iVar12 < 0x100) && (fVar13 = local_4c, iVar12 < 0)) {
        fVar13 = 0.0;
      }
      local_7a = (undefined1)(int)(fVar13 * local_74);
      sVar5 = fwrite(&local_7a,1,1,__s);
      if (sVar5 == 0) goto LAB_001094f9;
      if (((int)local_58 == 4) || ((int)local_58 == 2)) {
        iVar12 = *(int *)(*(long *)((long)&image->comps->data + local_38) + uVar10 * 4);
        fVar13 = 255.0;
        if (iVar12 < 0x100) {
          if (iVar12 < 0) {
            fVar13 = 0.0;
          }
          else {
            fVar13 = (float)iVar12;
          }
        }
        local_7a = (undefined1)(int)(fVar13 * local_74);
        sVar5 = fwrite(&local_7a,1,1,__s);
        if (sVar5 == 0) goto LAB_001094f9;
      }
      uVar9 = uVar9 + 1;
      OVar11 = OVar11 - 1;
    } while (OVar11 != 0);
    iVar4 = 0;
    OVar11 = local_60;
    OVar8 = local_64;
    OVar6 = local_5c;
  }
LAB_001094e9:
  if (iVar4 != 0) {
    iVar12 = 1;
    if (iVar4 != 5) {
      return 1;
    }
    goto LAB_00109528;
  }
  OVar6 = OVar6 + 1;
  if (OVar6 == OVar8) {
    iVar12 = 0;
LAB_00109528:
    fclose(__s);
    return iVar12;
  }
  goto LAB_0010931a;
}

Assistant:

int imagetotga(opj_image_t * image, const char *outfile)
{
    int width, height, bpp, x, y;
    OPJ_BOOL write_alpha;
    unsigned int i;
    int adjustR, adjustG = 0, adjustB = 0, fails;
    unsigned int alpha_channel;
    float r, g, b, a;
    unsigned char value;
    float scale;
    FILE *fdest;
    size_t res;
    fails = 1;

    fdest = fopen(outfile, "wb");
    if (!fdest) {
        fprintf(stderr, "ERROR -> failed to open %s for writing\n", outfile);
        return 1;
    }

    for (i = 0; i < image->numcomps - 1; i++) {
        if ((image->comps[0].dx != image->comps[i + 1].dx)
                || (image->comps[0].dy != image->comps[i + 1].dy)
                || (image->comps[0].prec != image->comps[i + 1].prec)
                || (image->comps[0].sgnd != image->comps[i + 1].sgnd)) {
            fclose(fdest);
            fprintf(stderr,
                    "Unable to create a tga file with such J2K image charateristics.\n");
            return 1;
        }
    }

    width  = (int)image->comps[0].w;
    height = (int)image->comps[0].h;

    /* Mono with alpha, or RGB with alpha. */
    write_alpha = (image->numcomps == 2) || (image->numcomps == 4);

    /* Write TGA header  */
    bpp = write_alpha ? 32 : 24;

    if (!tga_writeheader(fdest, bpp, width, height, OPJ_TRUE)) {
        goto fin;
    }

    alpha_channel = image->numcomps - 1;

    scale = 255.0f / (float)((1 << image->comps[0].prec) - 1);

    adjustR = (image->comps[0].sgnd ? 1 << (image->comps[0].prec - 1) : 0);
    if (image->numcomps >= 3) {
        adjustG = (image->comps[1].sgnd ? 1 << (image->comps[1].prec - 1) : 0);
        adjustB = (image->comps[2].sgnd ? 1 << (image->comps[2].prec - 1) : 0);
    }

    for (y = 0; y < height; y++) {
        unsigned int index = (unsigned int)(y * width);

        for (x = 0; x < width; x++, index++) {
            r = (float)(image->comps[0].data[index] + adjustR);

            if (image->numcomps > 2) {
                g = (float)(image->comps[1].data[index] + adjustG);
                b = (float)(image->comps[2].data[index] + adjustB);
            } else {
                /* Greyscale ... */
                g = r;
                b = r;
            }

            /* TGA format writes BGR ... */
            if (b > 255.) {
                b = 255.;
            } else if (b < 0.) {
                b = 0.;
            }
            value = (unsigned char)(b * scale);
            res = fwrite(&value, 1, 1, fdest);

            if (res < 1) {
                fprintf(stderr, "failed to write 1 byte for %s\n", outfile);
                goto fin;
            }
            if (g > 255.) {
                g = 255.;
            } else if (g < 0.) {
                g = 0.;
            }
            value = (unsigned char)(g * scale);
            res = fwrite(&value, 1, 1, fdest);

            if (res < 1) {
                fprintf(stderr, "failed to write 1 byte for %s\n", outfile);
                goto fin;
            }
            if (r > 255.) {
                r = 255.;
            } else if (r < 0.) {
                r = 0.;
            }
            value = (unsigned char)(r * scale);
            res = fwrite(&value, 1, 1, fdest);

            if (res < 1) {
                fprintf(stderr, "failed to write 1 byte for %s\n", outfile);
                goto fin;
            }

            if (write_alpha) {
                a = (float)(image->comps[alpha_channel].data[index]);
                if (a > 255.) {
                    a = 255.;
                } else if (a < 0.) {
                    a = 0.;
                }
                value = (unsigned char)(a * scale);
                res = fwrite(&value, 1, 1, fdest);

                if (res < 1) {
                    fprintf(stderr, "failed to write 1 byte for %s\n", outfile);
                    goto fin;
                }
            }
        }
    }
    fails = 0;
fin:
    fclose(fdest);

    return fails;
}